

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::fundrawtransaction(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCResult> __l_04;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffc478;
  allocator<RPCArg> *paVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffc480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc488;
  undefined4 in_stack_ffffffffffffc490;
  VType in_stack_ffffffffffffc494;
  UniValue *in_stack_ffffffffffffc498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc4b0;
  UniValue *in_stack_ffffffffffffc4b8;
  iterator in_stack_ffffffffffffc4c0;
  RPCArgOptions *in_stack_ffffffffffffc4c8;
  string *in_stack_ffffffffffffc4d0;
  undefined7 in_stack_ffffffffffffc4d8;
  undefined1 in_stack_ffffffffffffc4df;
  undefined4 in_stack_ffffffffffffc4e0;
  Type in_stack_ffffffffffffc4e4;
  string *in_stack_ffffffffffffc4e8;
  undefined4 in_stack_ffffffffffffc4f0;
  Type in_stack_ffffffffffffc4f4;
  undefined4 in_stack_ffffffffffffc4f8;
  Type in_stack_ffffffffffffc4fc;
  RPCArg *in_stack_ffffffffffffc500;
  RPCArgOptions *in_stack_ffffffffffffc520;
  undefined1 *local_3a70;
  undefined1 *local_3a58;
  RPCExamples *in_stack_ffffffffffffc5c0;
  RPCResults *in_stack_ffffffffffffc5c8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffc5d0;
  string *in_stack_ffffffffffffc5d8;
  string *in_stack_ffffffffffffc5e0;
  RPCHelpMan *in_stack_ffffffffffffc5e8;
  undefined1 *local_3a10;
  undefined1 *local_39f8;
  RPCMethodImpl *fun;
  undefined1 local_3608 [40];
  allocator<char> local_35e0;
  allocator<char> local_35df;
  allocator<char> local_35de;
  allocator<char> local_35dd;
  allocator<char> local_35dc;
  allocator<char> local_35db;
  allocator<char> local_35da [2];
  pointer local_35d8;
  pointer pRStack_35d0;
  undefined1 local_35c8 [15];
  allocator<char> local_35b9 [32];
  allocator<char> local_3599 [31];
  allocator<char> local_357a;
  allocator<char> local_3579 [31];
  allocator<char> local_355a;
  allocator<char> local_3559 [29];
  allocator<char> local_353c;
  allocator<char> local_353b;
  undefined1 local_353a [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_3538;
  allocator<char> local_351d;
  allocator<char> local_351c [3];
  allocator<char> local_3519;
  undefined4 local_3518;
  allocator<char> local_3512;
  allocator<char> local_3511;
  undefined4 local_3510;
  allocator<char> local_350a;
  allocator<char> local_3509;
  undefined4 local_3508;
  allocator<char> local_3501 [32];
  allocator<char> local_34e1;
  undefined4 local_34e0;
  allocator<char> local_34d9 [32];
  allocator<char> local_34b9;
  undefined4 local_34b8;
  allocator<char> local_34b3 [2];
  allocator<char> local_34b1;
  undefined4 local_34b0;
  allocator<char> local_34a9 [31];
  allocator<char> local_348a;
  allocator<char> local_3489;
  allocator<char> local_3488;
  allocator<char> local_3487;
  allocator<char> local_3486;
  allocator<char> local_3485;
  allocator<char> local_3484;
  undefined1 local_3483;
  allocator<char> local_3482;
  allocator<char> local_3481;
  allocator<char> local_3480;
  allocator<char> local_347f;
  allocator<char> local_347e;
  allocator<char> local_347d;
  allocator<char> local_347c;
  allocator<char> local_347b;
  allocator<char> local_347a;
  allocator<char> local_3479;
  allocator<char> local_3478;
  allocator<char> local_3477;
  allocator<char> local_3476;
  allocator<char> local_3475;
  undefined4 local_3474;
  allocator<char> local_346e;
  allocator<char> local_346d;
  undefined4 local_346c;
  allocator<char> local_3467;
  allocator<char> local_3466;
  undefined1 local_3465;
  allocator<char> local_3464;
  allocator<char> local_3463;
  undefined1 local_3462;
  allocator<char> local_3461 [56];
  allocator<char> local_3429;
  undefined4 local_3428;
  allocator<char> local_3422;
  allocator<char> local_3421;
  undefined4 local_3420;
  allocator<char> local_3419 [31];
  allocator<char> local_33fa;
  allocator<char> local_33f9 [865];
  undefined1 local_3098 [152];
  undefined8 local_3000;
  undefined1 local_2f00 [200];
  undefined1 local_2e38;
  undefined8 local_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined1 local_2df8;
  undefined1 local_2df7;
  allocator<RPCArg> local_2d30 [40];
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 local_2cf8;
  undefined1 local_2cf0;
  undefined1 local_2cef;
  undefined1 local_2ce8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 local_2cb0;
  undefined1 local_2ca8;
  undefined1 local_2ca7;
  allocator<RPCArg> local_2ba8 [40];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 local_2b70;
  undefined1 local_2b68;
  undefined1 local_2b67;
  allocator<RPCArg> local_2b60 [40];
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  undefined8 local_2b28;
  undefined1 local_2b20;
  undefined1 local_2b1f;
  undefined1 local_2b18;
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined1 local_2ad8;
  undefined1 local_2ad7;
  undefined1 local_2a30;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8;
  undefined1 local_29f0;
  undefined1 local_29ef;
  undefined1 local_2948;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 local_2910;
  undefined1 local_2908;
  undefined1 local_2907;
  undefined1 local_2860 [792];
  undefined1 local_2548 [160];
  undefined1 local_24a8 [264];
  undefined1 local_23a0 [160];
  allocator<RPCArg> local_2300 [40];
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined1 local_22c0;
  undefined1 local_22bf;
  undefined1 local_22b8;
  undefined8 local_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined1 local_2278;
  undefined1 local_2277;
  undefined1 local_21d0 [264];
  undefined1 local_20c8 [200];
  undefined8 local_2000;
  undefined1 local_1fb0;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined1 local_1f70;
  undefined1 local_1f6f;
  undefined1 local_1e88;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 local_1e50;
  undefined1 local_1e48;
  undefined1 local_1e47;
  undefined1 local_1d60;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined1 local_1d20;
  undefined1 local_1d1f;
  undefined1 local_1c20;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined1 local_1be0;
  undefined1 local_1bdf;
  undefined1 local_1b18;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined1 local_1ad8;
  undefined1 local_1ad7;
  undefined1 local_1a10;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined1 local_19d0;
  undefined1 local_19cf;
  undefined1 local_1908;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined1 local_18c8;
  undefined1 local_18c7;
  undefined1 local_1800;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined1 local_17c0;
  undefined1 local_17bf;
  undefined1 local_1718;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined1 local_16d8;
  undefined1 local_16d7;
  undefined1 local_15d8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined1 local_1598;
  undefined1 local_1597;
  undefined1 local_1498;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined1 local_1458;
  undefined1 local_1457;
  undefined1 local_1358 [856];
  undefined8 local_1000;
  undefined1 local_4e8 [160];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3420 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_448 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3428 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3462 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc4b8,(bool *)in_stack_ffffffffffffc4b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1498 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1470 = 0;
  uStack_1468 = 0;
  local_1460 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1458 = 0;
  local_1457 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3465 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc4b8,(bool *)in_stack_ffffffffffffc4b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_15d8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_15b0 = 0;
  uStack_15a8 = 0;
  local_15a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1598 = 0;
  local_1597 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_346c = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffc4b8,(int *)in_stack_ffffffffffffc4b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1718 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_16f0 = 0;
  uStack_16e8 = 0;
  local_16e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_16d8 = 0;
  local_16d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3474 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1800 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_17d8 = 0;
  uStack_17d0 = 0;
  local_17c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_17c0 = 0;
  local_17bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1908 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_18e0 = 0;
  uStack_18d8 = 0;
  local_18d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_18c8 = 0;
  local_18c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1a10 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_19e8 = 0;
  uStack_19e0 = 0;
  local_19d8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_19d0 = 0;
  local_19cf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1b18 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1af0 = 0;
  uStack_1ae8 = 0;
  local_1ae0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1ad8 = 0;
  local_1ad7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1c20 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1bf8 = 0;
  uStack_1bf0 = 0;
  local_1be8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1be0 = 0;
  local_1bdf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3483 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc4b8,(bool *)in_stack_ffffffffffffc4b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_1d60 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1d38 = 0;
  uStack_1d30 = 0;
  local_1d28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1d20 = 0;
  local_1d1f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::operator+(&in_stack_ffffffffffffc4c8->skip_type_check,&in_stack_ffffffffffffc4c0->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  local_1e88 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1e60 = 0;
  uStack_1e58 = 0;
  local_1e50 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1e48 = 0;
  local_1e47 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::operator+(&in_stack_ffffffffffffc4c8->skip_type_check,&in_stack_ffffffffffffc4c0->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  local_1fb0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_1f88 = 0;
  uStack_1f80 = 0;
  local_1f78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_1f70 = 0;
  local_1f6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  UniValue::UniValue(in_stack_ffffffffffffc498,in_stack_ffffffffffffc494,in_stack_ffffffffffffc488);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_34b0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_22b8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2290 = 0;
  uStack_2288 = 0;
  local_2280 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_2278 = 0;
  local_2277 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffc478);
  __l._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l._M_array = in_stack_ffffffffffffc4c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b8,__l,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  local_2300[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_22d8 = 0;
  uStack_22d0 = 0;
  local_22c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc478);
  local_22c0 = 0;
  local_22bf = 0;
  paVar3 = local_2300;
  RPCArg::RPCArg(in_stack_ffffffffffffc500,
                 (string *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 in_stack_ffffffffffffc4f4,(Fallback *)in_stack_ffffffffffffc4e8,
                 (string *)CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_34b8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_34e0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3508._0_1_ = false;
  local_3508._1_1_ = false;
  local_3508._2_2_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2948 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2920 = 0;
  uStack_2918 = 0;
  local_2910 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2908 = 0;
  local_2907 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3510 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2a30 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2a08 = 0;
  uStack_2a00 = 0;
  local_29f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_29f0 = 0;
  local_29ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3518 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,&in_stack_ffffffffffffc480->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2b18 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2af0 = 0;
  uStack_2ae8 = 0;
  local_2ae0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2ad8 = 0;
  local_2ad7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<RPCArg>::allocator(paVar3);
  __l_00._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l_00._M_array = in_stack_ffffffffffffc4c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b8,__l_00,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  local_2b60[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2b38 = 0;
  uStack_2b30 = 0;
  local_2b28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2b20 = 0;
  local_2b1f = 0;
  paVar3 = local_2b60;
  RPCArg::RPCArg(in_stack_ffffffffffffc500,
                 (string *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 in_stack_ffffffffffffc4f4,(Fallback *)in_stack_ffffffffffffc4e8,
                 (string *)CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc520);
  std::allocator<RPCArg>::allocator(paVar3);
  __l_01._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l_01._M_array = in_stack_ffffffffffffc4c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b8,__l_01,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  local_2ba8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2b80 = 0;
  uStack_2b78 = 0;
  local_2b70 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2b68 = 0;
  local_2b67 = 0;
  paVar3 = local_2ba8;
  RPCArg::RPCArg(in_stack_ffffffffffffc500,
                 (string *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 in_stack_ffffffffffffc4f4,(Fallback *)in_stack_ffffffffffffc4e8,
                 (string *)CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  UniValue::UniValue<const_int_&,_int,_true>
            (in_stack_ffffffffffffc4b8,(int *)in_stack_ffffffffffffc4b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2ce8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2cc0 = 0;
  uStack_2cb8 = 0;
  local_2cb0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2ca8 = 0;
  local_2ca7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<RPCArg>::allocator(paVar3);
  __l_02._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l_02._M_array = in_stack_ffffffffffffc4c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b8,__l_02,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  FundTxDoc(&local_3538,true);
  Cat<std::vector<RPCArg,std::allocator<RPCArg>>>
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b0,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4a8);
  local_2d30[0] = (allocator<RPCArg>)0x1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2d08 = 0;
  uStack_2d00 = 0;
  local_2cf8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2cf0 = 0;
  local_2cef = 0;
  paVar3 = local_2d30;
  RPCArg::RPCArg(in_stack_ffffffffffffc500,
                 (string *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 in_stack_ffffffffffffc4f4,(Fallback *)in_stack_ffffffffffffc4e8,
                 (string *)CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc520);
  fun = (RPCMethodImpl *)local_353a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc488,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_2e38 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490));
  local_2e10 = 0;
  uStack_2e08 = 0;
  local_2e00 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar3);
  local_2df8 = 0;
  local_2df7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
                 in_stack_ffffffffffffc4e8,in_stack_ffffffffffffc4e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc4df,in_stack_ffffffffffffc4d8),
                 in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
  std::allocator<RPCArg>::allocator(paVar3);
  __l_03._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l_03._M_array = in_stack_ffffffffffffc4c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc4b8,__l_03,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_3599[1] = (allocator<char>)0x0;
  local_3599[2] = (allocator<char>)0x0;
  local_3599[3] = (allocator<char>)0x0;
  local_3599[4] = (allocator<char>)0x0;
  local_3599[5] = (allocator<char>)0x0;
  local_3599[6] = (allocator<char>)0x0;
  local_3599[7] = (allocator<char>)0x0;
  local_3599[8] = (allocator<char>)0x0;
  local_3599[9] = (allocator<char>)0x0;
  local_3599[10] = (allocator<char>)0x0;
  local_3599[0xb] = (allocator<char>)0x0;
  local_3599[0xc] = (allocator<char>)0x0;
  local_3599[0xd] = (allocator<char>)0x0;
  local_3599[0xe] = (allocator<char>)0x0;
  local_3599[0xf] = (allocator<char>)0x0;
  local_3599[0x10] = (allocator<char>)0x0;
  local_3599[0x11] = (allocator<char>)0x0;
  local_3599[0x12] = (allocator<char>)0x0;
  local_3599[0x13] = (allocator<char>)0x0;
  local_3599[0x14] = (allocator<char>)0x0;
  local_3599[0x15] = (allocator<char>)0x0;
  local_3599[0x16] = (allocator<char>)0x0;
  local_3599[0x17] = (allocator<char>)0x0;
  local_3599[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc500,in_stack_ffffffffffffc4fc,
             (string *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
             in_stack_ffffffffffffc4e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
             (bool)in_stack_ffffffffffffc4df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::operator+(&in_stack_ffffffffffffc4c8->skip_type_check,&in_stack_ffffffffffffc4c0->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  local_35b9[1] = (allocator<char>)0x0;
  local_35b9[2] = (allocator<char>)0x0;
  local_35b9[3] = (allocator<char>)0x0;
  local_35b9[4] = (allocator<char>)0x0;
  local_35b9[5] = (allocator<char>)0x0;
  local_35b9[6] = (allocator<char>)0x0;
  local_35b9[7] = (allocator<char>)0x0;
  local_35b9[8] = (allocator<char>)0x0;
  local_35b9[9] = (allocator<char>)0x0;
  local_35b9[10] = (allocator<char>)0x0;
  local_35b9[0xb] = (allocator<char>)0x0;
  local_35b9[0xc] = (allocator<char>)0x0;
  local_35b9[0xd] = (allocator<char>)0x0;
  local_35b9[0xe] = (allocator<char>)0x0;
  local_35b9[0xf] = (allocator<char>)0x0;
  local_35b9[0x10] = (allocator<char>)0x0;
  local_35b9[0x11] = (allocator<char>)0x0;
  local_35b9[0x12] = (allocator<char>)0x0;
  local_35b9[0x13] = (allocator<char>)0x0;
  local_35b9[0x14] = (allocator<char>)0x0;
  local_35b9[0x15] = (allocator<char>)0x0;
  local_35b9[0x16] = (allocator<char>)0x0;
  local_35b9[0x17] = (allocator<char>)0x0;
  local_35b9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc500,in_stack_ffffffffffffc4fc,
             (string *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
             in_stack_ffffffffffffc4e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
             (bool)in_stack_ffffffffffffc4df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  local_35d8 = (pointer)0x0;
  pRStack_35d0 = (pointer)0x0;
  local_35c8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc500,in_stack_ffffffffffffc4fc,
             (string *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
             in_stack_ffffffffffffc4e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
             (bool)in_stack_ffffffffffffc4df);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar3);
  __l_04._M_len = (size_type)in_stack_ffffffffffffc4c8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffc4c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc4b8,__l_04,
             (allocator_type *)in_stack_ffffffffffffc4b0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc500,in_stack_ffffffffffffc4fc,
             (string *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0),
             in_stack_ffffffffffffc4e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc4e4,in_stack_ffffffffffffc4e0),
             (bool)in_stack_ffffffffffffc4df);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffc4f4,in_stack_ffffffffffffc4f0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  HelpExampleCli(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 in_stack_ffffffffffffc488);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  HelpExampleCli(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  HelpExampleCli(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc494,in_stack_ffffffffffffc490),
                 (char *)in_stack_ffffffffffffc488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc4c8,(char *)in_stack_ffffffffffffc4c0,
             (allocator<char> *)in_stack_ffffffffffffc4b8);
  HelpExampleCli(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  std::operator+(in_stack_ffffffffffffc4b0,in_stack_ffffffffffffc4a8);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0xc8e0c1);
  this = (RPCArg *)local_3608;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::fundrawtransaction()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffc488,(anon_class_1_0_00000001 *)in_stack_ffffffffffffc480);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffc5e8,in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8,
             in_stack_ffffffffffffc5d0,in_stack_ffffffffffffc5c8,in_stack_ffffffffffffc5c0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_3608 + 0x27));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35e0);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35df);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35de);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35dd);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35dc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_35db);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_35da);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_39f8 = local_2f00;
  do {
    local_39f8 = local_39f8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_39f8 != local_3098);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc488);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_35c8 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_35b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc488);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3599);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc488);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_357a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3579);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_355a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3559);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  local_3a10 = local_48;
  do {
    local_3a10 = local_3a10 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3a10 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_353c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_353b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_353a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_353a + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_1358;
  puVar1 = local_4e8;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_351d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_351c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_23a0;
  do {
    puVar2 = puVar2 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar2 != local_24a8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3a58 = local_2548;
  do {
    local_3a58 = local_3a58 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3a58 != local_2860);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3519);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3512);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3511);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_350a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3509);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3501);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_34e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_34d9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_34b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_34b3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc488);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3a70 = local_20c8;
  do {
    local_3a70 = local_3a70 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3a70 != local_21d0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_34b1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_34a9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_348a);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3489);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3488);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3487);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3486);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3485);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3484);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3482);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3481);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3480);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347f);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347e);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_347a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3479);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3478);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3477);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3476);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3475);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_346e);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_346d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3467);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3466);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3464);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3463);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3461);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3429);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3422);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3421);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3419);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_33fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_33f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan fundrawtransaction()
{
    return RPCHelpMan{"fundrawtransaction",
                "\nIf the transaction has no inputs, they will be automatically selected to meet its out value.\n"
                "It will add at most one change output to the outputs.\n"
                "No existing outputs will be modified unless \"subtractFeeFromOutputs\" is specified.\n"
                "Note that inputs which were signed may need to be resigned after completion since in/outputs have been added.\n"
                "The inputs added will not be signed, use signrawtransactionwithkey\n"
                "or signrawtransactionwithwallet for that.\n"
                "All existing inputs must either have their previous output transaction be in the wallet\n"
                "or be in the UTXO set. Solving data must be provided for non-wallet inputs.\n"
                "Note that all inputs selected must be of standard form and P2SH scripts must be\n"
                "in the wallet using importaddress or addmultisigaddress (to calculate fees).\n"
                "You can see whether this is the case by checking the \"solvable\" field in the listunspent output.\n"
                "Only pay-to-pubkey, multisig, and P2SH versions thereof are currently supported for watch-only\n",
                {
                    {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hex string of the raw transaction"},
                    {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "For backward compatibility: passing in a true instead of an object will result in {\"includeWatching\":true}",
                        Cat<std::vector<RPCArg>>(
                        {
                            {"add_inputs", RPCArg::Type::BOOL, RPCArg::Default{true}, "For a transaction with existing inputs, automatically include more if they are not enough."},
                            {"include_unsafe", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include inputs that are not safe to spend (unconfirmed transactions from outside keys and unconfirmed replacement transactions).\n"
                                                          "Warning: the resulting transaction may become invalid if one of the unsafe inputs disappears.\n"
                                                          "If that happens, you will need to fund the transaction with different inputs and republish it."},
                            {"minconf", RPCArg::Type::NUM, RPCArg::Default{0}, "If add_inputs is specified, require inputs with at least this many confirmations."},
                            {"maxconf", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "If add_inputs is specified, require inputs with at most this many confirmations."},
                            {"changeAddress", RPCArg::Type::STR, RPCArg::DefaultHint{"automatic"}, "The bitcoin address to receive the change"},
                            {"changePosition", RPCArg::Type::NUM, RPCArg::DefaultHint{"random"}, "The index of the change output"},
                            {"change_type", RPCArg::Type::STR, RPCArg::DefaultHint{"set by -changetype"}, "The output type to use. Only valid if changeAddress is not specified. Options are \"legacy\", \"p2sh-segwit\", \"bech32\", and \"bech32m\"."},
                            {"includeWatching", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Also select inputs which are watch only.\n"
                                                          "Only solvable inputs can be used. Watch-only destinations are solvable if the public key and/or output script was imported,\n"
                                                          "e.g. with 'importpubkey' or 'importmulti' with the 'pubkeys' or 'desc' field."},
                            {"lockUnspents", RPCArg::Type::BOOL, RPCArg::Default{false}, "Lock selected unspent outputs"},
                            {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
                            {"feeRate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_UNIT + "/kvB."},
                            {"subtractFeeFromOutputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The integers.\n"
                                                          "The fee will be equally deducted from the amount of each specified output.\n"
                                                          "Those recipients will receive less bitcoins than you enter in their corresponding amount field.\n"
                                                          "If no outputs are specified here, the sender pays the fee.",
                                {
                                    {"vout_index", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "The zero-based output index, before a change output is added."},
                                },
                            },
                            {"input_weights", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "Inputs and their corresponding weights",
                                {
                                    {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                        {
                                            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                            {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output index"},
                                            {"weight", RPCArg::Type::NUM, RPCArg::Optional::NO, "The maximum weight for this input, "
                                                "including the weight of the outpoint and sequence number. "
                                                "Note that serialized signature sizes are not guaranteed to be consistent, "
                                                "so the maximum DER signatures size of 73 bytes should be used when considering ECDSA signatures."
                                                "Remember to convert serialized sizes to weight units when necessary."},
                                        },
                                    },
                                },
                             },
                            {"max_tx_weight", RPCArg::Type::NUM, RPCArg::Default{MAX_STANDARD_TX_WEIGHT}, "The maximum acceptable transaction weight.\n"
                                                          "Transaction building will fail if this can not be satisfied."},
                        },
                        FundTxDoc()),
                        RPCArgOptions{
                            .skip_type_check = true,
                            .oneline_description = "options",
                        }},
                    {"iswitness", RPCArg::Type::BOOL, RPCArg::DefaultHint{"depends on heuristic tests"}, "Whether the transaction hex is a serialized witness transaction.\n"
                        "If iswitness is not present, heuristic tests will be used in decoding.\n"
                        "If true, only witness deserialization will be tried.\n"
                        "If false, only non-witness deserialization will be tried.\n"
                        "This boolean should reflect whether the transaction has inputs\n"
                        "(e.g. fully valid, or on-chain transactions), if known by the caller."
                    },
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "hex", "The resulting raw transaction (hex-encoded string)"},
                        {RPCResult::Type::STR_AMOUNT, "fee", "Fee in " + CURRENCY_UNIT + " the resulting transaction pays"},
                        {RPCResult::Type::NUM, "changepos", "The position of the added change output, or -1"},
                    }
                                },
                                RPCExamples{
                            "\nCreate a transaction with no inputs\n"
                            + HelpExampleCli("createrawtransaction", "\"[]\" \"{\\\"myaddress\\\":0.01}\"") +
                            "\nAdd sufficient unsigned inputs to meet the output value\n"
                            + HelpExampleCli("fundrawtransaction", "\"rawtransactionhex\"") +
                            "\nSign the transaction\n"
                            + HelpExampleCli("signrawtransactionwithwallet", "\"fundedtransactionhex\"") +
                            "\nSend the transaction\n"
                            + HelpExampleCli("sendrawtransaction", "\"signedtransactionhex\"")
                                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // parse hex string from parameter
    CMutableTransaction tx;
    bool try_witness = request.params[2].isNull() ? true : request.params[2].get_bool();
    bool try_no_witness = request.params[2].isNull() ? true : !request.params[2].get_bool();
    if (!DecodeHexTx(tx, request.params[0].get_str(), try_no_witness, try_witness)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed");
    }
    UniValue options = request.params[1];
    std::vector<std::pair<CTxDestination, CAmount>> destinations;
    for (const auto& tx_out : tx.vout) {
        CTxDestination dest;
        ExtractDestination(tx_out.scriptPubKey, dest);
        destinations.emplace_back(dest, tx_out.nValue);
    }
    std::vector<std::string> dummy(destinations.size(), "dummy");
    std::vector<CRecipient> recipients = CreateRecipients(
            destinations,
            InterpretSubtractFeeFromOutputInstructions(options["subtractFeeFromOutputs"], dummy)
    );
    CCoinControl coin_control;
    // Automatically select (additional) coins. Can be overridden by options.add_inputs.
    coin_control.m_allow_other_inputs = true;
    // Clear tx.vout since it is not meant to be used now that we are passing outputs directly.
    // This sets us up for a future PR to completely remove tx from the function signature in favor of passing inputs directly
    tx.vout.clear();
    auto txr = FundTransaction(*pwallet, tx, recipients, options, coin_control, /*override_min_fee=*/true);

    UniValue result(UniValue::VOBJ);
    result.pushKV("hex", EncodeHexTx(*txr.tx));
    result.pushKV("fee", ValueFromAmount(txr.fee));
    result.pushKV("changepos", txr.change_pos ? (int)*txr.change_pos : -1);

    return result;
},
    };
}